

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O0

_Bool tcg_region_alloc(TCGContext_conflict9 *s)

{
  size_t sVar1;
  _Bool _Var2;
  size_t size_full;
  _Bool err;
  TCGContext_conflict9 *s_local;
  
  sVar1 = s->code_gen_buffer_size;
  _Var2 = tcg_region_alloc__locked(s);
  if (!_Var2) {
    (s->region).agg_size_full = (sVar1 - 0x400) + (s->region).agg_size_full;
  }
  return _Var2;
}

Assistant:

static bool tcg_region_alloc(TCGContext *s)
{
    bool err;
    /* read the region size now; alloc__locked will overwrite it on success */
    size_t size_full = s->code_gen_buffer_size;

    err = tcg_region_alloc__locked(s);
    if (!err) {
        s->region.agg_size_full += size_full - TCG_HIGHWATER;
    }
    return err;
}